

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O0

DirectoryEntry * __thiscall
stick::fs::DirectoryEntry::operator=(DirectoryEntry *this,DirectoryEntry *param_1)

{
  DirectoryEntry *param_1_local;
  DirectoryEntry *this_local;
  
  String::operator=(&this->m_path,&param_1->m_path);
  FileStatus::operator=(&this->m_status,&param_1->m_status);
  return this;
}

Assistant:

class STICK_API DirectoryEntry
{
  public:
    /**
     * @brief Default Constructor.
     */
    DirectoryEntry();

    /**
     * @brief Creates a directory entry with with provided path.
     */
    explicit DirectoryEntry(const String & _path);

    /**
     * @brief Returns the path of the entry.
     */
    const String & path() const;

    /**
     * @brief Returns the file status of the entry.
     */
    const FileStatus & status() const;

    /**
     * @brief Returns true if this entry has the same path as the other one.
     */
    bool operator==(const DirectoryEntry & _other) const;

    /**
     * @brief Returns true if this entry has not the same path as the other one.
     */
    bool operator!=(const DirectoryEntry & _other) const;

    /**
     * @brief To sort by path.
     */
    bool operator<(const DirectoryEntry & _other) const;

    /**
     * @brief To sort by path.
     */
    bool operator<=(const DirectoryEntry & _other) const;

    /**
     * @brief To sort by path.
     */
    bool operator>(const DirectoryEntry & _other) const;

    /**
     * @brief To sort by path.
     */
    bool operator>=(const DirectoryEntry & _other) const;

  private:
    String m_path;
    FileStatus m_status;
}